

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::IntersectingQuadsTest::render
          (IntersectingQuadsTest *this,Context *ctx,Surface *dst)

{
  undefined8 uVar1;
  deUint32 program;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  Vector<float,_3> local_218;
  Vector<float,_3> local_20c;
  Vector<float,_3> local_200;
  Vector<float,_3> local_1f4;
  Vector<float,_3> local_1e8;
  Vector<float,_3> local_1dc;
  undefined1 local_1d0 [8];
  Framebuffer fbo;
  int height;
  int width;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  undefined1 local_178 [4];
  deUint32 texShaderID;
  SingleTex2DShader texShader;
  Surface *dst_local;
  Context *ctx_local;
  IntersectingQuadsTest *this_local;
  
  texShader.super_ShaderProgram._336_8_ = dst;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_178);
  program = (*ctx->_vptr_Context[0x75])(ctx,(SingleTex2DShader *)local_178);
  createMetaballsTex2D(ctx,1,0x1907,0x1401,0x40,0x40);
  createQuadsTex2D(ctx,2,0x1907,0x1401,0x40,0x40);
  uVar3 = this->m_fboWidth;
  fbo.m_stencilbuffer = this->m_fboHeight;
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Framebuffer::Framebuffer((Framebuffer *)local_1d0,ctx,pFVar5,uVar3,fbo.m_stencilbuffer,0,0,0,0);
  Framebuffer::checkCompleteness((Framebuffer *)local_1d0);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_178,ctx,program,0);
  dVar2 = Framebuffer::getFramebuffer((Framebuffer *)local_1d0);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar2);
  (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar3,(ulong)fbo.m_stencilbuffer);
  (*ctx->_vptr_Context[0x2a])(0x3f800000,0);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  tcu::Vector<float,_3>::Vector(&local_1dc,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_1e8,1.0,1.0,1.0);
  sglr::drawQuad(ctx,program,&local_1dc,&local_1e8);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  tcu::Vector<float,_3>::Vector(&local_1f4,-1.0,-1.0,1.0);
  tcu::Vector<float,_3>::Vector(&local_200,1.0,1.0,-1.0);
  sglr::drawQuad(ctx,program,&local_1f4,&local_200);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  pFVar5 = Framebuffer::getConfig((Framebuffer *)local_1d0);
  if (pFVar5->colorbufferType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    dVar2 = Framebuffer::getColorbuffer((Framebuffer *)local_1d0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)dVar2);
    uVar3 = (*ctx->_vptr_Context[2])();
    uVar4 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar3,(ulong)uVar4);
    tcu::Vector<float,_3>::Vector(&local_20c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_218,1.0,1.0,0.0);
    sglr::drawQuad(ctx,program,&local_20c,&local_218);
    uVar1 = texShader.super_ShaderProgram._336_8_;
    uVar3 = (*ctx->_vptr_Context[2])();
    uVar4 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[0x80])(ctx,uVar1,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  else {
    (*ctx->_vptr_Context[0x80])
              (ctx,texShader.super_ShaderProgram._336_8_,0,0,(ulong)uVar3,(ulong)fbo.m_stencilbuffer
              );
  }
  Framebuffer::~Framebuffer((Framebuffer *)local_1d0);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_178);
  return;
}

Assistant:

void IntersectingQuadsTest::render (sglr::Context& ctx, Surface& dst)
{
	SingleTex2DShader	texShader;
	deUint32			texShaderID = ctx.createProgram(&texShader);

	deUint32 metaballsTex	= 1;
	deUint32 quadsTex		= 2;

	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	int width	= m_fboWidth;
	int height	= m_fboHeight;
	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texShader.setUnit(ctx, texShaderID, 0);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		ctx.readPixels(dst, 0, 0, width, height);
	}
}